

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleTypeHandler<1UL>::SimpleTypeHandler
          (SimpleTypeHandler<1UL> *this,SimpleTypeHandler<1UL> *typeHandler,bool unused)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SimplePropertyDescriptor *pSVar4;
  int i;
  long lVar5;
  SimplePropertyDescriptor *this_00;
  
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,1,
             (typeHandler->super_DynamicTypeHandler).inlineSlotCapacity,
             (typeHandler->super_DynamicTypeHandler).offsetOfInlineSlots,'\x01');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_013dd8c8
  ;
  this->propertyCount = typeHandler->propertyCount;
  this->descriptors[0].Id.ptr = (PropertyRecord *)0x0;
  this->descriptors[0].field_1.preventFalseReference = (Type)0x0;
  this->descriptors[0].field_1.Attributes = '\a';
  if (((typeHandler->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x11,"(typeHandler->GetIsInlineSlotCapacityLocked())",
                                "typeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = this->descriptors;
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  pSVar4 = typeHandler->descriptors;
  for (lVar5 = 0; lVar5 < this->propertyCount; lVar5 = lVar5 + 1) {
    SimplePropertyDescriptor::operator=(this_00,pSVar4);
    this_00 = this_00 + 1;
    pSVar4 = pSVar4 + 1;
  }
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(SimpleTypeHandler<size> * typeHandler, bool unused)
        : DynamicTypeHandler(sizeof(descriptors) / sizeof(SimplePropertyDescriptor),
            typeHandler->GetInlineSlotCapacity(), typeHandler->GetOffsetOfInlineSlots()), propertyCount(typeHandler->propertyCount)
    {
        Assert(typeHandler->GetIsInlineSlotCapacityLocked());
        SetIsInlineSlotCapacityLocked();
        for (int i = 0; i < propertyCount; i++)
        {
            descriptors[i] = typeHandler->descriptors[i];
        }
    }